

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

size_t fiobj_str_concat(FIOBJ dest,FIOBJ obj)

{
  size_t sVar1;
  fio_str_info_s local_50;
  undefined1 local_38 [8];
  fio_str_info_s o;
  FIOBJ obj_local;
  FIOBJ dest_local;
  
  o.data = (char *)obj;
  sVar1 = fiobj_type_is(dest,FIOBJ_T_STRING);
  if (sVar1 != 0) {
    if (*(char *)((dest & 0xfffffffffffffff8) + 0x11) == '\0') {
      *(undefined8 *)((dest & 0xfffffffffffffff8) + 8) = 0;
      fiobj_obj2cstr((fio_str_info_s *)local_38,(FIOBJ)o.data);
      if (o.capa == 0) {
        dest_local = fio_str_len((fio_str_s_conflict *)((dest & 0xfffffffffffffff8) + 0x10));
      }
      else {
        fio_str_write(&local_50,(fio_str_s_conflict *)((dest & 0xfffffffffffffff8) + 0x10),
                      (void *)o.len,o.capa);
        dest_local = local_50.len;
      }
    }
    else {
      dest_local = 0;
    }
    return dest_local;
  }
  __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fiobj/fiobj_str.c"
                ,0x137,"size_t fiobj_str_concat(FIOBJ, FIOBJ)");
}

Assistant:

size_t fiobj_str_concat(FIOBJ dest, FIOBJ obj) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  fio_str_info_s o = fiobj_obj2cstr(obj);
  if (o.len == 0)
    return fio_str_len(&obj2str(dest)->str);
  return fio_str_write(&obj2str(dest)->str, o.data, o.len).len;
}